

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1.c
# Opt level: O3

void t1_encode_cblks(opj_t1_t *t1,opj_tcd_tile_t *tile,opj_tcp_t *tcp)

{
  opj_tcd_band_t *poVar1;
  byte *pbVar2;
  float fVar3;
  short sVar4;
  int iVar5;
  opj_tcd_tilecomp_t *poVar6;
  opj_tccp_t *poVar7;
  opj_tcd_resolution_t *poVar8;
  opj_tcd_precinct_t *poVar9;
  opj_tcd_cblk_enc_t *poVar10;
  int *piVar11;
  opj_mqc_t *mqc;
  flag_t *pfVar12;
  opj_mqc_t *poVar13;
  opj_mqc_t *mqc_00;
  uint uVar14;
  int iVar15;
  opj_bool oVar16;
  int iVar17;
  uint uVar18;
  long lVar19;
  opj_tcd_pass_t *poVar20;
  byte bVar21;
  int level;
  uint uVar22;
  uint uVar23;
  int iVar24;
  long lVar25;
  uint *puVar26;
  long lVar27;
  bool bVar28;
  byte bVar29;
  byte bVar30;
  int iVar31;
  short *psVar32;
  int iVar33;
  uint uVar34;
  long lVar35;
  ushort *flagsp;
  ulong uVar36;
  int iVar37;
  uint uVar38;
  ushort uVar39;
  int *piVar40;
  long lVar41;
  long lVar42;
  opj_tcd_cblk_enc_t *poVar43;
  int *piVar44;
  long lVar45;
  long lVar46;
  ulong uVar47;
  ulong uVar48;
  int iVar49;
  int iVar50;
  uint uVar51;
  long lVar52;
  bool bVar53;
  bool bVar54;
  bool bVar55;
  float fVar56;
  double dVar57;
  undefined1 auVar58 [16];
  int local_1a8;
  ulong local_198;
  int local_18c;
  double local_168;
  long local_140;
  double local_d8;
  
  tile->distotile = 0.0;
  iVar15 = tile->numcomps;
  if (0 < iVar15) {
    local_140 = 0;
    do {
      poVar6 = tile->comps;
      iVar33 = poVar6[local_140].numresolutions;
      if (0 < iVar33) {
        iVar15 = poVar6[local_140].x1;
        iVar5 = poVar6[local_140].x0;
        poVar7 = tcp->tccps;
        lVar46 = 0;
        do {
          poVar8 = poVar6[local_140].resolutions;
          iVar37 = poVar8[lVar46].numbands;
          if (0 < iVar37) {
            iVar33 = poVar8[lVar46].pw;
            iVar49 = poVar8[lVar46].ph;
            lVar45 = 0;
            do {
              if (0 < iVar49 * iVar33) {
                poVar1 = poVar8[lVar46].bands + lVar45;
                fVar56 = floorf(poVar1->stepsize * 8192.0);
                lVar27 = 0;
                do {
                  poVar9 = poVar1->precincts;
                  if (0 < poVar9[lVar27].ch * poVar9[lVar27].cw) {
                    lVar42 = 0;
                    do {
                      poVar10 = poVar9[lVar27].cblks.enc;
                      iVar33 = poVar10[lVar42].x0 - poVar1->x0;
                      if ((poVar1->bandno & 1U) != 0) {
                        iVar33 = (iVar33 + poVar6[local_140].resolutions[lVar46 + -1].x1) -
                                 poVar6[local_140].resolutions[lVar46 + -1].x0;
                      }
                      iVar37 = poVar10[lVar42].y0 - poVar1->y0;
                      if ((poVar1->bandno & 2U) != 0) {
                        iVar37 = (iVar37 + poVar6[local_140].resolutions[lVar46 + -1].y1) -
                                 poVar6[local_140].resolutions[lVar46 + -1].y0;
                      }
                      poVar43 = poVar10 + lVar42;
                      oVar16 = allocate_buffers(t1,poVar43->x1 - poVar10[lVar42].x0,
                                                poVar43->y1 - poVar10[lVar42].y0);
                      if (oVar16 == 0) {
                        return;
                      }
                      piVar11 = t1->data;
                      uVar18 = t1->w;
                      uVar22 = t1->h;
                      piVar40 = poVar6[local_140].data + (iVar37 * (iVar15 - iVar5) + iVar33);
                      if (poVar7[local_140].qmfbid == 1) {
                        if ((int)uVar22 < 1) {
                          bVar53 = true;
                        }
                        else {
                          uVar47 = 0;
                          piVar44 = piVar11;
                          do {
                            if (0 < (int)uVar18) {
                              uVar48 = 0;
                              do {
                                piVar44[uVar48] = piVar40[uVar48] << 6;
                                uVar48 = uVar48 + 1;
                              } while (uVar18 != uVar48);
                            }
                            uVar47 = uVar47 + 1;
                            piVar44 = piVar44 + (int)uVar18;
                            piVar40 = piVar40 + ((long)iVar15 - (long)iVar5);
                          } while (uVar47 != uVar22);
LAB_00206617:
                          bVar53 = poVar7[local_140].qmfbid == 1;
                        }
                      }
                      else {
                        if (0 < (int)uVar22) {
                          uVar47 = 0;
                          piVar44 = piVar11;
                          do {
                            if (0 < (int)uVar18) {
                              uVar48 = 0;
                              do {
                                lVar19 = (long)piVar40[uVar48] *
                                         (long)(int)(0x4000000 / (long)(int)fVar56);
                                piVar44[uVar48] =
                                     (int)((ulong)((uint)lVar19 & 0x1000) + lVar19 >> 0xd) >> 5;
                                uVar48 = uVar48 + 1;
                              } while (uVar18 != uVar48);
                            }
                            uVar47 = uVar47 + 1;
                            piVar44 = piVar44 + (int)uVar18;
                            piVar40 = piVar40 + ((long)iVar15 - (long)iVar5);
                          } while (uVar47 != uVar22);
                          goto LAB_00206617;
                        }
                        bVar53 = false;
                      }
                      iVar37 = poVar1->bandno;
                      level = poVar6[local_140].numresolutions + ~(uint)lVar46;
                      fVar3 = poVar1->stepsize;
                      uVar18 = poVar7[local_140].cblksty;
                      iVar49 = tile->numcomps;
                      iVar17 = tcp->mct;
                      uVar22 = t1->h * t1->w;
                      mqc = t1->mqc;
                      iVar33 = 0;
                      if (0 < (int)uVar22) {
                        uVar47 = 0;
                        uVar23 = 0;
                        do {
                          uVar34 = piVar11[uVar47];
                          uVar51 = -uVar34;
                          if (0 < (int)uVar34) {
                            uVar51 = uVar34;
                          }
                          if ((int)uVar51 < (int)uVar23) {
                            uVar51 = uVar23;
                          }
                          uVar23 = uVar51;
                          uVar47 = uVar47 + 1;
                        } while (uVar22 != uVar47);
                        if (uVar23 == 0) {
                          iVar33 = 0;
                        }
                        else {
                          iVar33 = -5;
                          if (uVar23 != 1) {
                            uVar47 = (ulong)uVar23;
                            do {
                              uVar47 = uVar47 >> 1;
                              iVar33 = iVar33 + 1;
                              bVar28 = 3 < uVar23;
                              uVar23 = (uint)uVar47;
                            } while (bVar28);
                          }
                        }
                      }
                      poVar43->numbps = iVar33;
                      mqc_resetstates(mqc);
                      mqc_setstate(mqc,0x12,0,0x2e);
                      mqc_setstate(mqc,0x11,0,3);
                      mqc_setstate(mqc,0,0,4);
                      mqc_init_enc(mqc,poVar43->data);
                      lVar19 = 0;
                      if (0 < iVar33) {
                        iVar33 = iVar33 + -1;
                        auVar58._0_4_ = -(uint)((uVar18 & 2) == 0);
                        auVar58._4_4_ = -(uint)((uVar18 & 1) == 0);
                        auVar58._8_4_ = -(uint)((uVar18 & 4) == 0);
                        auVar58._12_4_ = -(uint)((uVar18 & 0x20) == 0);
                        bVar54 = iVar17 != 0;
                        bVar28 = iVar49 == 3 && bVar54;
                        uVar22 = movmskps(CONCAT31((int3)iVar37,bVar54),auVar58);
                        bVar29 = ((byte)uVar22 & 2) >> 1;
                        local_18c = 2;
                        local_d8 = 0.0;
                        lVar19 = 0;
                        do {
                          poVar20 = poVar43->passes + lVar19;
                          bVar30 = (byte)uVar18 & 1;
                          if (poVar43->numbps + -4 <= iVar33) {
                            bVar30 = 0;
                          }
                          if (1 < local_18c) {
                            bVar30 = 0;
                          }
                          bVar21 = (byte)iVar33;
                          if (local_18c == 2) {
                            uVar23 = 0x40 << (bVar21 & 0x1f);
                            iVar49 = t1->h;
                            if (iVar49 < 1) {
                              iVar17 = 0;
                            }
                            else {
                              poVar13 = t1->mqc;
                              psVar32 = lut_nmsedec_sig;
                              if (iVar33 == 0) {
                                psVar32 = lut_nmsedec_sig0;
                              }
                              uVar47 = (ulong)(uint)t1->w;
                              iVar17 = 0;
                              local_198 = 0;
                              do {
                                if (0 < (int)uVar47) {
                                  uVar48 = local_198 | 3;
                                  lVar35 = 0;
                                  do {
                                    bVar30 = 1;
                                    uVar34 = (uint)local_198;
                                    if ((long)uVar48 < (long)t1->h) {
                                      lVar25 = (long)t1->flags_stride;
                                      pfVar12 = t1->flags;
                                      if ((uVar18 & 8) != 0) {
                                        if ((((pfVar12[(local_198 + 1) * lVar25 + lVar35 + 1] &
                                              0x50ffU) == 0) &&
                                            ((pfVar12[(local_198 | 2) * lVar25 + lVar35 + 1] &
                                             0x50ffU) == 0)) &&
                                           ((pfVar12[uVar48 * lVar25 + lVar35 + 1] & 0x50ffU) == 0))
                                        {
                                          uVar39 = 0x50b9;
                                          goto LAB_00206d76;
                                        }
                                        goto LAB_00206b70;
                                      }
                                      if ((((pfVar12[(local_198 + 1) * lVar25 + lVar35 + 1] &
                                            0x50ffU) != 0) ||
                                          ((pfVar12[(local_198 | 2) * lVar25 + lVar35 + 1] & 0x50ffU
                                           ) != 0)) ||
                                         ((pfVar12[uVar48 * lVar25 + lVar35 + 1] & 0x50ffU) != 0))
                                      goto LAB_00206b70;
                                      uVar39 = 0x50ff;
LAB_00206d76:
                                      bVar30 = 1;
                                      if ((pfVar12[lVar25 * (local_198 + 4) + lVar35 + 1] & uVar39)
                                          != 0) goto LAB_00206b70;
                                      puVar26 = (uint *)(local_198 * 4 * (long)(int)uVar47 +
                                                         lVar35 * 4 + (long)t1->data);
                                      uVar36 = 0;
                                      do {
                                        uVar51 = *puVar26;
                                        uVar38 = -uVar51;
                                        if (0 < (int)uVar51) {
                                          uVar38 = uVar51;
                                        }
                                        if ((uVar23 & uVar38) != 0) goto LAB_00206de1;
                                        uVar36 = uVar36 + 1;
                                        puVar26 = puVar26 + (int)uVar47;
                                      } while (uVar36 != 4);
                                      uVar36 = 4;
LAB_00206de1:
                                      poVar13->curctx = poVar13->ctxs + 0x11;
                                      uVar51 = (uint)uVar36;
                                      mqc_encode(poVar13,(uint)(uVar51 != 4));
                                      if (uVar51 != 4) {
                                        poVar13->curctx = poVar13->ctxs + 0x12;
                                        mqc_encode(poVar13,(uint)(uVar36 >> 1) & 0x7fffffff);
                                        mqc_encode(poVar13,uVar51 & 1);
                                        if (uVar51 < 4) {
                                          uVar34 = uVar51 + uVar34;
                                          bVar30 = 0;
                                          goto LAB_00206b70;
                                        }
                                      }
                                    }
                                    else {
LAB_00206b70:
                                      uVar47 = (ulong)uVar34;
                                      lVar25 = 0;
                                      do {
                                        iVar49 = (int)(uVar47 + lVar25);
                                        if (t1->h <= iVar49) break;
                                        bVar54 = true;
                                        if ((uVar18 & 8) != 0) {
                                          if ((-3 - local_198) + uVar47 + lVar25 == 0) {
                                            bVar54 = false;
                                          }
                                          else {
                                            bVar54 = uVar47 + lVar25 != (ulong)(t1->h - 1);
                                          }
                                        }
                                        pfVar12 = t1->flags;
                                        lVar41 = (long)(int)(uVar34 + (int)lVar25 + 1) *
                                                 (long)t1->flags_stride;
                                        flagsp = (ushort *)(pfVar12 + lVar35 + lVar41 + 1);
                                        lVar52 = (long)iVar49 * (long)t1->w;
                                        piVar11 = t1->data;
                                        mqc_00 = t1->mqc;
                                        uVar39 = *flagsp;
                                        uVar51 = uVar39 & 0xfffffbb9;
                                        if (bVar54) {
                                          uVar51 = (uint)uVar39;
                                        }
                                        if ((bool)(lVar25 != 0 | bVar30)) {
                                          if ((uVar39 & 0x5000) == 0) {
                                            mqc_00->curctx =
                                                 mqc_00->ctxs +
                                                 ""[(int)(uVar51 & 0xff | iVar37 << 8)];
                                            uVar38 = piVar11[lVar35 + lVar52];
                                            uVar14 = -uVar38;
                                            if (0 < (int)uVar38) {
                                              uVar14 = uVar38;
                                            }
                                            mqc_encode(mqc_00,(uint)((uVar23 & uVar14) != 0));
                                            if ((uVar23 & uVar14) != 0) goto LAB_00206cab;
                                          }
                                        }
                                        else {
LAB_00206cab:
                                          uVar38 = piVar11[lVar35 + lVar52];
                                          uVar14 = -uVar38;
                                          if (0 < (int)uVar38) {
                                            uVar14 = uVar38;
                                          }
                                          iVar17 = iVar17 + psVar32[uVar14 >> (bVar21 & 0x1f) & 0x7f
                                                                   ];
                                          uVar51 = uVar51 >> 4 & 0xff;
                                          mqc_00->curctx =
                                               mqc_00->ctxs +
                                               "\t\n\f\r\n\n\r\r\f\r\f\r\r\r\r\r\t\n\f\v\n\t\r\f\f\v\f\v\r\f\r\f\t\n\f\v\n\n\v\v\f\r\t\n\r\r\n\n\t\n\f\r\n\t\v\f\f\v\t\n\r\f\n\t\t\n\f\r\n\t\v\f\f\r\f\r\v\f\v\f\t\n\f\v\n\n\v\v\f\v\f\v\v\v\v\v\t\n\f\v\n\t\r\f\f\r\t\n\v\f\n\t\t\n\f\r\n\n\r\r\f\v\t\n\v\v\n\n\t\n\f\r\n\n\r\r\f\v\t\n\v\v\n\n\t\n\f\v\n\t\r\f\f\r\t\n\v\f\n\t\t\n\f\v\n\n\v\v\f\v\f\v\v\v\v\v\t\n\f\r\n\t\v\f\f\r\f\r\v\f\v\f\t\n\f\r\n\t\v\f\f\v\t\n\r\f\n\t\t\n\f\v\n\n\v\v\f\r\t\n\r\r\n\n\t\n\f\v\n\t\r\f\f\v\f\v\r\f\r\f\t\n\f\r\n\n\r\r\f\r\f\r\r\r\r\r"
                                               [uVar51];
                                          mqc_encode(mqc_00,(int)""[uVar51] ^ uVar38 >> 0x1f);
                                          t1_updateflags((flag_t *)flagsp,uVar38 >> 0x1f,
                                                         t1->flags_stride);
                                        }
                                        pbVar2 = (byte *)((long)pfVar12 +
                                                         lVar41 * 2 + lVar35 * 2 + 3);
                                        *pbVar2 = *pbVar2 & 0xbf;
                                        lVar41 = uVar47 + lVar25;
                                        lVar25 = lVar25 + 1;
                                      } while (lVar41 + 1U < (local_198 + 4 & 0xffffffff));
                                    }
                                    lVar35 = lVar35 + 1;
                                    uVar47 = (ulong)t1->w;
                                  } while (lVar35 < (long)uVar47);
                                  iVar49 = t1->h;
                                }
                                local_198 = local_198 + 4;
                              } while ((long)local_198 < (long)iVar49);
                            }
                            if ((byte)((byte)uVar22 >> 3) == 0) {
                              mqc_segmark_enc(mqc);
                            }
                          }
                          else if (local_18c == 1) {
                            iVar49 = t1->h;
                            if (iVar49 < 1) {
LAB_002070d9:
                              iVar17 = 0;
                            }
                            else {
                              psVar32 = lut_nmsedec_ref;
                              if (iVar33 == 0) {
                                psVar32 = lut_nmsedec_ref0;
                              }
                              iVar24 = t1->w;
                              iVar17 = 0;
                              iVar31 = 0;
                              do {
                                if (0 < iVar24) {
                                  iVar49 = 0;
                                  do {
                                    iVar50 = 4;
                                    iVar24 = iVar31;
                                    do {
                                      if (t1->h <= iVar24) break;
                                      bVar54 = true;
                                      if ((uVar18 & 8) != 0) {
                                        if (iVar50 == 1) {
                                          bVar54 = false;
                                        }
                                        else {
                                          bVar54 = iVar24 != t1->h + -1;
                                        }
                                      }
                                      pfVar12 = t1->flags;
                                      lVar35 = (long)(t1->flags_stride * (iVar24 + 1) + iVar49);
                                      uVar39 = pfVar12[lVar35 + 1];
                                      uVar23 = uVar39 & 0xfffffbb9;
                                      if (bVar54) {
                                        uVar23 = (uint)uVar39;
                                      }
                                      if ((uVar23 & 0x5000) == 0x1000) {
                                        uVar34 = t1->data[iVar24 * t1->w + iVar49];
                                        uVar51 = -uVar34;
                                        if (0 < (int)uVar34) {
                                          uVar51 = uVar34;
                                        }
                                        poVar13 = t1->mqc;
                                        uVar47 = (ulong)(0xf - ((char)uVar23 == '\0'));
                                        if ((uVar23 >> 0xd & 1) != 0) {
                                          uVar47 = 0x10;
                                        }
                                        sVar4 = psVar32[uVar51 >> (bVar21 & 0x1f) & 0x7f];
                                        poVar13->curctx = poVar13->ctxs + uVar47;
                                        uVar23 = (uint)((0x40 << (bVar21 & 0x1f) & uVar51) != 0);
                                        if (bVar30 == 0) {
                                          mqc_encode(poVar13,uVar23);
                                        }
                                        else {
                                          mqc_bypass_enc(poVar13,uVar23);
                                        }
                                        iVar17 = iVar17 + sVar4;
                                        pbVar2 = (byte *)((long)pfVar12 + lVar35 * 2 + 3);
                                        *pbVar2 = *pbVar2 | 0x20;
                                      }
                                      iVar50 = iVar50 + -1;
                                      iVar24 = iVar24 + 1;
                                    } while (iVar50 != 0);
                                    iVar49 = iVar49 + 1;
                                    iVar24 = t1->w;
                                  } while (iVar49 < iVar24);
                                  iVar49 = t1->h;
                                }
                                iVar31 = iVar31 + 4;
                              } while (iVar31 < iVar49);
                            }
                          }
                          else {
                            iVar49 = t1->h;
                            if (iVar49 < 1) goto LAB_002070d9;
                            psVar32 = lut_nmsedec_sig;
                            if (iVar33 == 0) {
                              psVar32 = lut_nmsedec_sig0;
                            }
                            iVar24 = t1->w;
                            iVar17 = 0;
                            local_1a8 = 0;
                            do {
                              if (0 < iVar24) {
                                iVar49 = 0;
                                do {
                                  iVar31 = 4;
                                  iVar24 = local_1a8;
                                  do {
                                    if (t1->h <= iVar24) break;
                                    bVar54 = true;
                                    if ((uVar18 & 8) != 0) {
                                      if (iVar31 == 1) {
                                        bVar54 = false;
                                      }
                                      else {
                                        bVar54 = iVar24 != t1->h + -1;
                                      }
                                    }
                                    pfVar12 = t1->flags;
                                    lVar35 = (long)(t1->flags_stride * (iVar24 + 1) + iVar49);
                                    uVar23 = (ushort)pfVar12[lVar35 + 1] & 0xfffffbb9;
                                    if (bVar54) {
                                      uVar23 = (uint)(ushort)pfVar12[lVar35 + 1];
                                    }
                                    if ((uVar23 & 0x5000) == 0 && (uVar23 & 0xff) != 0) {
                                      poVar13 = t1->mqc;
                                      piVar11 = t1->data;
                                      iVar50 = iVar24 * t1->w + iVar49;
                                      uVar34 = piVar11[iVar50];
                                      uVar51 = -uVar34;
                                      if (0 < (int)uVar34) {
                                        uVar51 = uVar34;
                                      }
                                      uVar51 = uVar51 & 0x40 << (bVar21 & 0x1f);
                                      poVar13->curctx =
                                           poVar13->ctxs + ""[(int)(uVar23 & 0xff | iVar37 << 8)];
                                      uVar34 = (uint)(uVar51 != 0);
                                      if (bVar30 == 0) {
                                        mqc_encode(poVar13,uVar34);
                                      }
                                      else {
                                        mqc_bypass_enc(poVar13,uVar34);
                                      }
                                      if (uVar51 != 0) {
                                        uVar34 = piVar11[iVar50];
                                        uVar38 = uVar34 >> 0x1f;
                                        uVar51 = -uVar34;
                                        if (0 < (int)uVar34) {
                                          uVar51 = uVar34;
                                        }
                                        sVar4 = psVar32[uVar51 >> (bVar21 & 0x1f) & 0x7f];
                                        uVar23 = uVar23 >> 4 & 0xff;
                                        poVar13->curctx =
                                             poVar13->ctxs +
                                             "\t\n\f\r\n\n\r\r\f\r\f\r\r\r\r\r\t\n\f\v\n\t\r\f\f\v\f\v\r\f\r\f\t\n\f\v\n\n\v\v\f\r\t\n\r\r\n\n\t\n\f\r\n\t\v\f\f\v\t\n\r\f\n\t\t\n\f\r\n\t\v\f\f\r\f\r\v\f\v\f\t\n\f\v\n\n\v\v\f\v\f\v\v\v\v\v\t\n\f\v\n\t\r\f\f\r\t\n\v\f\n\t\t\n\f\r\n\n\r\r\f\v\t\n\v\v\n\n\t\n\f\r\n\n\r\r\f\v\t\n\v\v\n\n\t\n\f\v\n\t\r\f\f\r\t\n\v\f\n\t\t\n\f\v\n\n\v\v\f\v\f\v\v\v\v\v\t\n\f\r\n\t\v\f\f\r\f\r\v\f\v\f\t\n\f\r\n\t\v\f\f\v\t\n\r\f\n\t\t\n\f\v\n\n\v\v\f\r\t\n\r\r\n\n\t\n\f\v\n\t\r\f\f\v\f\v\r\f\r\f\t\n\f\r\n\n\r\r\f\r\f\r\r\r\r\r"
                                             [uVar23];
                                        if (bVar30 == 0) {
                                          mqc_encode(poVar13,(int)""[uVar23] ^ uVar38);
                                        }
                                        else {
                                          mqc_bypass_enc(poVar13,uVar38);
                                        }
                                        iVar17 = iVar17 + sVar4;
                                        t1_updateflags(pfVar12 + lVar35 + 1,uVar38,t1->flags_stride)
                                        ;
                                      }
                                      pbVar2 = (byte *)((long)pfVar12 + lVar35 * 2 + 3);
                                      *pbVar2 = *pbVar2 | 0x40;
                                    }
                                    iVar31 = iVar31 + -1;
                                    iVar24 = iVar24 + 1;
                                  } while (iVar31 != 0);
                                  iVar49 = iVar49 + 1;
                                  iVar24 = t1->w;
                                } while (iVar49 < iVar24);
                                iVar49 = t1->h;
                              }
                              local_1a8 = local_1a8 + 4;
                            } while (local_1a8 < iVar49);
                          }
                          if (bVar53) {
                            local_168 = 1.0;
                            if (bVar28) {
                              local_168 = mct_getnorm((int)local_140);
                            }
                            dVar57 = dwt_getnorm(level,iVar37);
                          }
                          else {
                            local_168 = 1.0;
                            if (bVar28) {
                              local_168 = mct_getnorm_real((int)local_140);
                            }
                            dVar57 = dwt_getnorm_real(level,iVar37);
                          }
                          dVar57 = (double)(1 << (bVar21 & 0x1f)) *
                                   dVar57 * (double)fVar3 * local_168;
                          dVar57 = dVar57 * dVar57 * (double)iVar17 * 0.0001220703125;
                          tile->distotile = tile->distotile + dVar57;
                          if (((uVar22 & 4) == 0) && (local_18c != 2 || iVar33 != 0)) {
LAB_002071f4:
                            mqc_flush(mqc);
                            bVar54 = true;
                            iVar49 = 1;
                            iVar17 = 1;
                          }
                          else {
                            iVar49 = poVar43->numbps + -4;
                            if ((local_18c < 1) || (iVar49 <= iVar33)) {
                              if ((local_18c != 2 || iVar49 != iVar33) || bVar29 != 0)
                              goto LAB_00207217;
                              goto LAB_002071f4;
                            }
                            if (bVar29 == 0) goto LAB_002071f4;
LAB_00207217:
                            iVar17 = 3;
                            iVar49 = 0;
                            bVar54 = false;
                          }
                          poVar20->term = iVar49;
                          local_18c = local_18c + 1;
                          bVar55 = local_18c == 3;
                          if (bVar55) {
                            local_18c = 0;
                          }
                          iVar33 = iVar33 - (uint)bVar55;
                          if ((bVar54) && (0 < iVar33)) {
                            if ((local_18c < 2 && bVar29 == 0) && iVar33 < poVar43->numbps + -4) {
                              mqc_bypass_init_enc(mqc);
                            }
                            else {
                              mqc_restart_init_enc(mqc);
                            }
                          }
                          local_d8 = local_d8 + dVar57;
                          poVar20->distortiondec = local_d8;
                          iVar49 = mqc_numbytes(mqc);
                          poVar20->rate = iVar49 + iVar17;
                          if ((uVar22 & 1) == 0) {
                            mqc_reset_enc(mqc);
                          }
                          lVar19 = lVar19 + 1;
                        } while (-1 < iVar33);
                      }
                      if ((uVar18 & 0x10) == 0) {
                        if ((uVar18 & 1) == 0) {
                          mqc_flush(mqc);
                        }
                      }
                      else {
                        mqc_erterm_enc(mqc);
                      }
                      poVar43->totalpasses = (int)lVar19;
                      if (0 < (int)lVar19) {
                        lVar19 = 0;
                        lVar35 = 0;
                        do {
                          poVar20 = poVar43->passes;
                          iVar33 = *(int *)((long)&poVar20->rate + lVar19);
                          iVar37 = mqc_numbytes(mqc);
                          if (iVar37 < iVar33) {
                            uVar18 = mqc_numbytes(mqc);
                            *(uint *)((long)&poVar20->rate + lVar19) = uVar18;
                          }
                          else {
                            uVar18 = *(uint *)((long)&poVar20->rate + lVar19);
                          }
                          if ((1 < (int)uVar18) && (poVar43->data[(ulong)uVar18 - 1] == 0xff)) {
                            uVar18 = uVar18 - 1;
                            *(uint *)((long)&poVar20->rate + lVar19) = uVar18;
                          }
                          if (lVar19 == 0) {
                            iVar33 = 0;
                          }
                          else {
                            iVar33 = *(int *)((long)&poVar43->passes[-1].rate + lVar19);
                          }
                          *(uint *)((long)&poVar20->len + lVar19) = uVar18 - iVar33;
                          lVar35 = lVar35 + 1;
                          lVar19 = lVar19 + 0x18;
                        } while (lVar35 < poVar43->totalpasses);
                      }
                      lVar42 = lVar42 + 1;
                    } while (lVar42 < (long)poVar9[lVar27].ch * (long)poVar9[lVar27].cw);
                    iVar33 = poVar8[lVar46].pw;
                    iVar49 = poVar8[lVar46].ph;
                  }
                  lVar27 = lVar27 + 1;
                } while (lVar27 < iVar49 * iVar33);
                iVar37 = poVar8[lVar46].numbands;
              }
              lVar45 = lVar45 + 1;
            } while (lVar45 < iVar37);
            iVar33 = poVar6[local_140].numresolutions;
          }
          lVar46 = lVar46 + 1;
        } while (lVar46 < iVar33);
        iVar15 = tile->numcomps;
      }
      local_140 = local_140 + 1;
    } while (local_140 < iVar15);
  }
  return;
}

Assistant:

void t1_encode_cblks(
		opj_t1_t *t1,
		opj_tcd_tile_t *tile,
		opj_tcp_t *tcp)
{
	int compno, resno, bandno, precno, cblkno;

	tile->distotile = 0;		/* fixed_quality */

	for (compno = 0; compno < tile->numcomps; ++compno) {
		opj_tcd_tilecomp_t* tilec = &tile->comps[compno];
		opj_tccp_t* tccp = &tcp->tccps[compno];
		int tile_w = tilec->x1 - tilec->x0;

		for (resno = 0; resno < tilec->numresolutions; ++resno) {
			opj_tcd_resolution_t *res = &tilec->resolutions[resno];

			for (bandno = 0; bandno < res->numbands; ++bandno) {
				opj_tcd_band_t* restrict band = &res->bands[bandno];
        int bandconst = 8192 * 8192 / ((int) floor(band->stepsize * 8192));

				for (precno = 0; precno < res->pw * res->ph; ++precno) {
					opj_tcd_precinct_t *prc = &band->precincts[precno];

					for (cblkno = 0; cblkno < prc->cw * prc->ch; ++cblkno) {
						opj_tcd_cblk_enc_t* cblk = &prc->cblks.enc[cblkno];
						int* restrict datap;
						int* restrict tiledp;
						int cblk_w;
						int cblk_h;
						int i, j;

						int x = cblk->x0 - band->x0;
						int y = cblk->y0 - band->y0;
						if (band->bandno & 1) {
							opj_tcd_resolution_t *pres = &tilec->resolutions[resno - 1];
							x += pres->x1 - pres->x0;
						}
						if (band->bandno & 2) {
							opj_tcd_resolution_t *pres = &tilec->resolutions[resno - 1];
							y += pres->y1 - pres->y0;
						}

						if(!allocate_buffers(
									t1,
									cblk->x1 - cblk->x0,
									cblk->y1 - cblk->y0))
						{
							return;
						}

						datap=t1->data;
						cblk_w = t1->w;
						cblk_h = t1->h;

						tiledp=&tilec->data[(y * tile_w) + x];
						if (tccp->qmfbid == 1) {
							for (j = 0; j < cblk_h; ++j) {
								for (i = 0; i < cblk_w; ++i) {
									int tmp = tiledp[(j * tile_w) + i];
									datap[(j * cblk_w) + i] = tmp << T1_NMSEDEC_FRACBITS;
								}
							}
						} else {		/* if (tccp->qmfbid == 0) */
							for (j = 0; j < cblk_h; ++j) {
								for (i = 0; i < cblk_w; ++i) {
									int tmp = tiledp[(j * tile_w) + i];
									datap[(j * cblk_w) + i] =
										fix_mul(
										tmp,
										bandconst) >> (11 - T1_NMSEDEC_FRACBITS);
								}
							}
						}

						t1_encode_cblk(
								t1,
								cblk,
								band->bandno,
								compno,
								tilec->numresolutions - 1 - resno,
								tccp->qmfbid,
								band->stepsize,
								tccp->cblksty,
								tile->numcomps,
								tcp->mct,
								tile);

					} /* cblkno */
				} /* precno */
			} /* bandno */
		} /* resno  */
	} /* compno  */
}